

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

bool __thiscall
basisu::vector<basist::ktx2_level_index>::try_resize
          (vector<basist::ktx2_level_index> *this,size_t new_size_size_t,bool grow_hint)

{
  bool bVar1;
  uint uVar2;
  undefined1 in_DL;
  ulong in_RSI;
  long in_RDI;
  uint32_t new_size;
  undefined2 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffca;
  undefined1 in_stack_ffffffffffffffcb;
  uint32_t in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  undefined3 uVar3;
  uint in_stack_ffffffffffffffd4;
  
  if (0xffffffff < in_RSI) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                  ,0x231,
                  "bool basisu::vector<basist::ktx2_level_index>::try_resize(size_t, bool) [T = basist::ktx2_level_index]"
                 );
  }
  uVar2 = (uint)in_RSI;
  if (*(uint *)(in_RDI + 8) != uVar2) {
    if (uVar2 < *(uint *)(in_RDI + 8)) {
      scalar_type<basist::ktx2_level_index>::destruct_array
                ((ktx2_level_index *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 CONCAT44(in_stack_ffffffffffffffcc,
                          CONCAT13(in_stack_ffffffffffffffcb,
                                   CONCAT12(in_stack_ffffffffffffffca,in_stack_ffffffffffffffc8))));
    }
    else {
      if (*(uint *)(in_RDI + 0xc) < uVar2) {
        uVar3 = (undefined3)in_stack_ffffffffffffffd4;
        in_stack_ffffffffffffffd4 = CONCAT13(1,uVar3);
        if (uVar2 != *(int *)(in_RDI + 8) + 1U) {
          in_stack_ffffffffffffffd4 = CONCAT13(in_DL,uVar3) & 0x1ffffff;
        }
        in_stack_ffffffffffffffd0 = uVar2;
        bVar1 = increase_capacity((vector<basist::ktx2_level_index> *)
                                  CONCAT44(in_stack_ffffffffffffffd4,uVar2),
                                  in_stack_ffffffffffffffcc,(bool)in_stack_ffffffffffffffcb,
                                  (bool)in_stack_ffffffffffffffca);
        if (!bVar1) {
          return false;
        }
      }
      scalar_type<basist::ktx2_level_index>::construct_array
                ((ktx2_level_index *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 CONCAT44(in_stack_ffffffffffffffcc,
                          CONCAT13(in_stack_ffffffffffffffcb,
                                   CONCAT12(in_stack_ffffffffffffffca,in_stack_ffffffffffffffc8))));
    }
    *(uint *)(in_RDI + 8) = uVar2;
  }
  return true;
}

Assistant:

inline bool try_resize(size_t new_size_size_t, bool grow_hint = false)
      {
         if (new_size_size_t > UINT32_MAX)
         {
            assert(0);
            return false;
         }

         uint32_t new_size = (uint32_t)new_size_size_t;

         if (m_size != new_size)
         {
            if (new_size < m_size)
               scalar_type<T>::destruct_array(m_p + new_size, m_size - new_size);
            else
            {
               if (new_size > m_capacity)
               {
                  if (!increase_capacity(new_size, (new_size == (m_size + 1)) || grow_hint, true))
                     return false;
               }

               scalar_type<T>::construct_array(m_p + m_size, new_size - m_size);
            }

            m_size = new_size;
         }

         return true;
      }